

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::GradX
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFNMatrix<54,_double> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3,1);
  TPZFNMatrix<54,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
  ;
  CornerCoordinates((TPZGeoElRefLess<pzgeom::TPZGeoLinear> *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd98);
  pzgeom::TPZGeoLinear::GradX<Fad<double>>
            ((TPZFMatrix<double> *)
             cornerco.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements,
             (TPZVec<Fad<double>_> *)
             cornerco.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore,
             (TPZFMatrix<Fad<double>_> *)
             cornerco.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x15fe64a);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<Fad<REAL> > &par, TPZFMatrix<Fad<REAL> > &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}